

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O1

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
::Consume::move_next(Consume *this)

{
  long *plVar1;
  ulong uVar2;
  uintptr_t uVar3;
  bool bVar4;
  ControlBlock *pCVar5;
  long in_FS_OFFSET;
  
  bVar4 = empty(this);
  if (bVar4) {
    density_tests::detail::assert_failed<unsigned_long&>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xd2,&this->m_next_ptr);
  }
  uVar2 = this->m_next_ptr;
  pCVar5 = (ControlBlock *)(uVar2 & 0xfffffffffffffff0);
  if (0xffff < ((ulong)this->m_control ^ uVar2)) {
    PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init();
    if (*(long *)(in_FS_OFFSET + -0x88) != 0) {
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::process_pending_unpins_impl
                (progress_lock_free);
    }
    LOCK();
    plVar1 = (long *)((uVar2 & 0xffffffffffff0000) + 0xfff8);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    uVar3 = this->m_control->m_next;
    PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page(this->m_control);
    if (uVar3 == 0) {
      this->m_control = pCVar5;
      begin_iteration(this,this->m_queue);
      return true;
    }
  }
  this->m_control = pCVar5;
  this->m_next_ptr = pCVar5->m_next;
  bVar4 = empty(this);
  if ((!bVar4) && (this->m_next_ptr < 0x10000)) {
    density_tests::detail::assert_failed<>
              ("empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xed);
  }
  return true;
}

Assistant:

bool move_next() noexcept
                {
                    DENSITY_ASSERT_INTERNAL(!empty(), m_next_ptr);

                    DENSITY_ASSUME_ALIGNED(m_control, Base::s_alloc_granularity);

                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);
                    if (!Base::same_page(m_control, next))
                    {
                        DENSITY_ASSUME(next != nullptr);
                        m_queue->ALLOCATOR_TYPE::pin_page(next);

                        auto const potentially_different_next_ptr =
                          raw_atomic_load(&m_control->m_next, mem_relaxed);

                        m_queue->ALLOCATOR_TYPE::unpin_page(m_control);

                        if (potentially_different_next_ptr == 0)
                        {
                            /* the control block has been zeroed in the meanwhile, we have to restart */
                            m_control = next;
                            begin_iteration(m_queue);
                            return true;
                        }
                    }

                    m_control  = next;
                    m_next_ptr = raw_atomic_load(&m_control->m_next, mem_relaxed);
                    DENSITY_ASSERT_INTERNAL(
                      empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment);
                    return true;
                }